

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Performance::anon_unknown_1::
BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>::init
          (BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>
           *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *this_00;
  ResultType RVar1;
  int iVar2;
  deUint32 err;
  undefined4 extraout_var;
  int numBytes;
  int numBytes_00;
  string local_1d8;
  string local_1b8;
  undefined1 local_198 [120];
  ios_base local_120 [264];
  
  iVar2 = (*((this->
             super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>
             ).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext[3])();
  BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>::init
            (&this->
              super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>
             ,ctx);
  local_198._0_8_ = local_198._0_8_ & 0xffffffffffffff00;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->m_zeroData,
             (long)(this->
                   super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>
                   ).m_bufferSizeMax,local_198);
  (**(code **)(CONCAT44(extraout_var,iVar2) + 0x6c8))(1,&this->m_dummyBufferID);
  err = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
  glu::checkError(err,"Gen buf",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/performance/es3pBufferDataUploadTests.cpp"
                  ,0x8e5);
  local_198._0_8_ =
       ((this->
        super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>
        ).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_198 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Testing performance with ",0x19);
  std::ostream::operator<<
            (this_00,(this->
                     super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>
                     ).m_numSamples);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,
             " test samples. Sample order is randomized. All samples at even positions (first = 0) are tested before samples at odd positions.\n"
             ,0x81);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Buffer sizes are in range [",0x1b);
  Performance::(anonymous_namespace)::getHumanReadableByteSize_abi_cxx11_
            (&local_1b8,
             (_anonymous_namespace_ *)
             (ulong)(uint)(this->
                          super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>
                          ).m_bufferSizeMin,numBytes);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
  Performance::(anonymous_namespace)::getHumanReadableByteSize_abi_cxx11_
            (&local_1d8,
             (_anonymous_namespace_ *)
             (ulong)(uint)(this->
                          super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>
                          ).m_bufferSizeMax,numBytes_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"].",2);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_120);
  if (this->m_logBufferInfo == true) {
    switch(this->m_caseType) {
    case CASE_NEW_BUFFER:
      local_198._0_8_ =
           ((this->
            super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>
            ).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_198 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_198 + 8),
                 "Target buffer is generated but not specified (i.e glBufferData() not called).",
                 0x4d);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
      break;
    case CASE_UNSPECIFIED_BUFFER:
      local_198._0_8_ =
           ((this->
            super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>
            ).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_198 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_198 + 8),"Target buffer is allocated with glBufferData(NULL).",
                 0x33);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
      break;
    case CASE_SPECIFIED_BUFFER:
      local_198._0_8_ =
           ((this->
            super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>
            ).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_198 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_198 + 8),
                 "Target buffer contents are specified prior testing with glBufferData(data).",0x4b)
      ;
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
      break;
    case CASE_USED_BUFFER:
      local_198._0_8_ =
           ((this->
            super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>
            ).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_198 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_198 + 8),"Target buffer has been used in drawing before testing."
                 ,0x36);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
      break;
    case CASE_USED_LARGER_BUFFER:
      local_198._0_8_ =
           ((this->
            super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>
            ).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_198 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_198 + 8),
                 "Target buffer is larger and has been used in drawing before testing.",0x44);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
      break;
    default:
      goto switchD_0131007b_default;
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_198 + 8));
    std::ios_base::~ios_base(local_120);
  }
switchD_0131007b_default:
  RVar1 = this->m_resultType;
  if (RVar1 == RESULT_ASYMPTOTIC_TRANSFER_RATE) {
    local_198._0_8_ =
         ((this->
          super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>
          ).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_198 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_198 + 8),
               "Test result is the asymptotic transfer rate as the buffer size approaches infinity."
               ,0x53);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    if (RVar1 != RESULT_MEDIAN_TRANSFER_RATE) {
      return RVar1;
    }
    local_198._0_8_ =
         ((this->
          super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>
          ).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_198 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_198 + 8),
               "Test result is the median transfer rate of the test samples.",0x3c);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_198 + 8));
  iVar2 = std::ios_base::~ios_base(local_120);
  return iVar2;
}

Assistant:

void BasicUploadCase<SampleType>::init (void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	BasicBufferCase<SampleType>::init();

	// zero buffer as upload source
	m_zeroData.resize(m_bufferSizeMax, 0x00);

	// dummy buffer

	gl.genBuffers(1, &m_dummyBufferID);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Gen buf");

	// log basic info

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Testing performance with " << m_numSamples << " test samples. Sample order is randomized. All samples at even positions (first = 0) are tested before samples at odd positions.\n"
		<< "Buffer sizes are in range [" << getHumanReadableByteSize(m_bufferSizeMin) << ", " << getHumanReadableByteSize(m_bufferSizeMax) << "]."
		<< tcu::TestLog::EndMessage;

	if (m_logBufferInfo)
	{
		switch (m_caseType)
		{
			case CASE_NO_BUFFERS:
				break;

			case CASE_NEW_BUFFER:
				m_testCtx.getLog() << tcu::TestLog::Message << "Target buffer is generated but not specified (i.e glBufferData() not called)." << tcu::TestLog::EndMessage;
				break;

			case CASE_UNSPECIFIED_BUFFER:
				m_testCtx.getLog() << tcu::TestLog::Message << "Target buffer is allocated with glBufferData(NULL)." << tcu::TestLog::EndMessage;
				break;

			case CASE_SPECIFIED_BUFFER:
				m_testCtx.getLog() << tcu::TestLog::Message << "Target buffer contents are specified prior testing with glBufferData(data)." << tcu::TestLog::EndMessage;
				break;

			case CASE_USED_BUFFER:
				m_testCtx.getLog() << tcu::TestLog::Message << "Target buffer has been used in drawing before testing." << tcu::TestLog::EndMessage;
				break;

			case CASE_USED_LARGER_BUFFER:
				m_testCtx.getLog() << tcu::TestLog::Message << "Target buffer is larger and has been used in drawing before testing." << tcu::TestLog::EndMessage;
				break;

			default:
				DE_ASSERT(false);
				break;
		}
	}

	if (m_resultType == RESULT_MEDIAN_TRANSFER_RATE)
		m_testCtx.getLog() << tcu::TestLog::Message << "Test result is the median transfer rate of the test samples." << tcu::TestLog::EndMessage;
	else if (m_resultType == RESULT_ASYMPTOTIC_TRANSFER_RATE)
		m_testCtx.getLog() << tcu::TestLog::Message << "Test result is the asymptotic transfer rate as the buffer size approaches infinity." << tcu::TestLog::EndMessage;
	else
		DE_ASSERT(false);
}